

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_plats.cpp
# Opt level: O0

bool EV_DoPlat(int tag,line_t_conflict *line,EPlatType type,double height,double speed,int delay,
              int lip,int change)

{
  bool bVar1;
  int iVar2;
  FTextureID tex;
  uint uVar3;
  sector_t_conflict *this;
  DPlat *this_00;
  size_t len;
  char *sound;
  double dVar4;
  double dVar5;
  FSectorTagIterator local_78;
  FSectorTagIterator itr;
  vertex_t *spot;
  double newheight;
  bool manual;
  bool rtn;
  sector_t *sec;
  int secnum;
  DPlat *plat;
  int change_local;
  int lip_local;
  int delay_local;
  double speed_local;
  double height_local;
  EPlatType type_local;
  line_t_conflict *line_local;
  int tag_local;
  
  newheight._7_1_ = false;
  spot = (vertex_t *)0x0;
  if (tag != 0) {
    if (type != platPerpetualRaise) {
      if (type != platToggle) goto LAB_005ce7ce;
      newheight._7_1_ = true;
    }
    P_ActivateInStasis(tag);
  }
LAB_005ce7ce:
  FSectorTagIterator::FSectorTagIterator(&local_78,tag,line);
  do {
    do {
      iVar2 = FSectorTagIterator::Next(&local_78);
      if (iVar2 < 0) {
        return newheight._7_1_;
      }
      this = sectors + iVar2;
      len = 0;
      bVar1 = sector_t::PlaneMoving((sector_t *)this,0);
    } while (bVar1);
    newheight._7_1_ = true;
    this_00 = (DPlat *)DObject::operator_new((DObject *)0x80,len);
    DPlat::DPlat(this_00,(sector_t *)this);
    this_00->m_Type = type;
    this_00->m_Crush = -1;
    this_00->m_Tag = tag;
    this_00->m_Speed = speed;
    this_00->m_Wait = delay;
    dVar4 = secplane_t::fD(&this->floorplane);
    this_00->m_Low = dVar4;
    if (change != 0) {
      if (line != (line_t_conflict *)0x0) {
        tex = sector_t::GetTexture((sector_t *)line->sidedef[0]->sector,0);
        sector_t::SetTexture((sector_t *)this,0,tex,true);
      }
      if (change == 1) {
        sector_t::ClearSpecial((sector_t *)this);
      }
    }
    switch(type) {
    case platPerpetualRaise:
      dVar4 = sector_t::FindLowestFloorSurrounding((sector_t *)this,(vertex_t **)&itr);
      dVar4 = secplane_t::PointToDist(&this->floorplane,(vertex_t *)itr,dVar4 + (double)lip);
      this_00->m_Low = dVar4;
      dVar4 = this_00->m_Low;
      dVar5 = secplane_t::fD(&this->floorplane);
      if (dVar4 < dVar5) {
        dVar4 = secplane_t::fD(&this->floorplane);
        this_00->m_Low = dVar4;
      }
      spot = (vertex_t *)sector_t::FindHighestFloorSurrounding((sector_t *)this,(vertex_t **)&itr);
      dVar4 = secplane_t::PointToDist(&this->floorplane,(vertex_t *)itr,(double)spot);
      this_00->m_High = dVar4;
      dVar4 = this_00->m_High;
      dVar5 = secplane_t::fD(&this->floorplane);
      if (dVar5 < dVar4) {
        dVar4 = secplane_t::fD(&this->floorplane);
        this_00->m_High = dVar4;
      }
      uVar3 = FRandom::operator()(&pr_doplat);
      this_00->m_Status = (uint)((uVar3 & 1) == 0);
      DPlat::PlayPlatSound(this_00,"Platform");
      break;
    case platDownWaitUpStay:
    case platDownWaitUpStayStone:
      dVar4 = sector_t::FindLowestFloorSurrounding((sector_t *)this,(vertex_t **)&itr);
      spot = (vertex_t *)(dVar4 + (double)lip);
      dVar4 = secplane_t::PointToDist(&this->floorplane,(vertex_t *)itr,(double)spot);
      this_00->m_Low = dVar4;
      dVar4 = this_00->m_Low;
      dVar5 = secplane_t::fD(&this->floorplane);
      if (dVar4 < dVar5) {
        dVar4 = secplane_t::fD(&this->floorplane);
        this_00->m_Low = dVar4;
      }
      dVar4 = secplane_t::fD(&this->floorplane);
      this_00->m_High = dVar4;
      this_00->m_Status = down;
      sound = "Floor";
      if (type == platDownWaitUpStay) {
        sound = "Platform";
      }
      DPlat::PlayPlatSound(this_00,sound);
      break;
    case platUpNearestWaitDownStay:
      spot = (vertex_t *)sector_t::FindNextHighestFloor((sector_t *)this,(vertex_t **)&itr);
    case platUpWaitDownStay:
      if (type == platUpWaitDownStay) {
        spot = (vertex_t *)sector_t::FindHighestFloorSurrounding((sector_t *)this,(vertex_t **)&itr)
        ;
      }
      dVar4 = secplane_t::PointToDist(&this->floorplane,(vertex_t *)itr,(double)spot);
      this_00->m_High = dVar4;
      dVar4 = secplane_t::fD(&this->floorplane);
      this_00->m_Low = dVar4;
      dVar4 = this_00->m_High;
      dVar5 = secplane_t::fD(&this->floorplane);
      if (dVar5 < dVar4) {
        dVar4 = secplane_t::fD(&this->floorplane);
        this_00->m_High = dVar4;
      }
      this_00->m_Status = up;
      DPlat::PlayPlatSound(this_00,"Platform");
      break;
    case platDownByValue:
      dVar4 = secplane_t::ZatPoint(&this->floorplane,&this->centerspot);
      spot = (vertex_t *)(dVar4 - height);
      dVar4 = secplane_t::PointToDist(&this->floorplane,&this->centerspot,(double)spot);
      this_00->m_Low = dVar4;
      dVar4 = secplane_t::fD(&this->floorplane);
      this_00->m_High = dVar4;
      this_00->m_Status = down;
      DPlat::PlayPlatSound(this_00,"Floor");
      break;
    case platUpByValue:
    case platUpByValueStay:
      dVar4 = secplane_t::ZatPoint(&this->floorplane,&this->centerspot);
      spot = (vertex_t *)(dVar4 + height);
      dVar4 = secplane_t::PointToDist(&this->floorplane,&this->centerspot,(double)spot);
      this_00->m_High = dVar4;
      dVar4 = secplane_t::fD(&this->floorplane);
      this_00->m_Low = dVar4;
      this_00->m_Status = up;
      DPlat::PlayPlatSound(this_00,"Floor");
      break;
    case platRaiseAndStay:
    case platRaiseAndStayLockout:
      spot = (vertex_t *)sector_t::FindNextHighestFloor((sector_t *)this,(vertex_t **)&itr);
      dVar4 = secplane_t::PointToDist(&this->floorplane,(vertex_t *)itr,(double)spot);
      this_00->m_High = dVar4;
      dVar4 = secplane_t::fD(&this->floorplane);
      this_00->m_Low = dVar4;
      this_00->m_Status = up;
      DPlat::PlayPlatSound(this_00,"Floor");
      sector_t::ClearSpecial((sector_t *)this);
      break;
    case platToggle:
      this_00->m_Crush = 10;
      spot = (vertex_t *)sector_t::FindLowestCeilingPoint((sector_t *)this,(vertex_t **)&itr);
      dVar4 = secplane_t::PointToDist(&this->floorplane,(vertex_t *)itr,(double)spot);
      this_00->m_Low = dVar4;
      dVar4 = secplane_t::fD(&this->floorplane);
      this_00->m_High = dVar4;
      this_00->m_Status = down;
      SN_StartSequence((sector_t *)this,1,"Silence",0);
      break;
    case platDownToNearestFloor:
      dVar4 = sector_t::FindNextLowestFloor((sector_t *)this,(vertex_t **)&itr);
      spot = (vertex_t *)(dVar4 + (double)lip);
      dVar4 = secplane_t::PointToDist(&this->floorplane,(vertex_t *)itr,(double)spot);
      this_00->m_Low = dVar4;
      this_00->m_Status = down;
      dVar4 = secplane_t::fD(&this->floorplane);
      this_00->m_High = dVar4;
      DPlat::PlayPlatSound(this_00,"Platform");
      break;
    case platDownToLowestCeiling:
      spot = (vertex_t *)sector_t::FindLowestCeilingSurrounding((sector_t *)this,(vertex_t **)&itr);
      dVar4 = secplane_t::PointToDist(&this->floorplane,(vertex_t *)itr,(double)spot);
      this_00->m_Low = dVar4;
      dVar4 = secplane_t::fD(&this->floorplane);
      this_00->m_High = dVar4;
      dVar4 = this_00->m_Low;
      dVar5 = secplane_t::fD(&this->floorplane);
      if (dVar4 < dVar5) {
        dVar4 = secplane_t::fD(&this->floorplane);
        this_00->m_Low = dVar4;
      }
      this_00->m_Status = down;
      DPlat::PlayPlatSound(this_00,"Platform");
    }
  } while( true );
}

Assistant:

bool EV_DoPlat (int tag, line_t *line, DPlat::EPlatType type, double height,
				double speed, int delay, int lip, int change)
{
	DPlat *plat;
	int secnum;
	sector_t *sec;
	bool rtn = false;
	bool manual = false;
	double newheight = 0;
	vertex_t *spot;

	if (tag != 0)
	{
		//	Activate all <type> plats that are in_stasis
		switch (type)
		{
		case DPlat::platToggle:
			rtn = true;
		case DPlat::platPerpetualRaise:
			P_ActivateInStasis (tag);
			break;

		default:
			break;
		}
	}


	// [RH] If tag is zero, use the sector on the back side
	//		of the activating line (if any).
	FSectorTagIterator itr(tag, line);
	while ((secnum = itr.Next()) >= 0)
	{
		sec = &sectors[secnum];

		if (sec->PlaneMoving(sector_t::floor))
		{
			continue;
		}

		// Find lowest & highest floors around sector
		rtn = true;
		plat = new DPlat (sec);

		plat->m_Type = type;
		plat->m_Crush = -1;
		plat->m_Tag = tag;
		plat->m_Speed = speed;
		plat->m_Wait = delay;

		//jff 1/26/98 Avoid raise plat bouncing a head off a ceiling and then
		//going down forever -- default lower to plat height when triggered
		plat->m_Low = sec->floorplane.fD();

		if (change)
		{
			if (line)
				sec->SetTexture(sector_t::floor, line->sidedef[0]->sector->GetTexture(sector_t::floor));
			if (change == 1) sec->ClearSpecial();
		}

		switch (type)
		{
		case DPlat::platRaiseAndStay:
		case DPlat::platRaiseAndStayLockout:
			newheight = sec->FindNextHighestFloor (&spot);
			plat->m_High = sec->floorplane.PointToDist (spot, newheight);
			plat->m_Low = sec->floorplane.fD();
			plat->m_Status = DPlat::up;
			plat->PlayPlatSound ("Floor");
			sec->ClearSpecial();
			break;

		case DPlat::platUpByValue:
		case DPlat::platUpByValueStay:
			newheight = sec->floorplane.ZatPoint (sec->centerspot) + height;
			plat->m_High = sec->floorplane.PointToDist (sec->centerspot, newheight);
			plat->m_Low = sec->floorplane.fD();
			plat->m_Status = DPlat::up;
			plat->PlayPlatSound ("Floor");
			break;
		
		case DPlat::platDownByValue:
			newheight = sec->floorplane.ZatPoint (sec->centerspot) - height;
			plat->m_Low = sec->floorplane.PointToDist (sec->centerspot, newheight);
			plat->m_High = sec->floorplane.fD();
			plat->m_Status = DPlat::down;
			plat->PlayPlatSound ("Floor");
			break;

		case DPlat::platDownWaitUpStay:
		case DPlat::platDownWaitUpStayStone:
			newheight = sec->FindLowestFloorSurrounding (&spot) + lip;
			plat->m_Low = sec->floorplane.PointToDist (spot, newheight);

			if (plat->m_Low < sec->floorplane.fD())
				plat->m_Low = sec->floorplane.fD();

			plat->m_High = sec->floorplane.fD();
			plat->m_Status = DPlat::down;
			plat->PlayPlatSound (type == DPlat::platDownWaitUpStay ? "Platform" : "Floor");
			break;
		
		case DPlat::platUpNearestWaitDownStay:
			newheight = sec->FindNextHighestFloor (&spot);
			// Intentional fall-through

		case DPlat::platUpWaitDownStay:
			if (type == DPlat::platUpWaitDownStay)
			{
				newheight = sec->FindHighestFloorSurrounding (&spot);
			}
			plat->m_High = sec->floorplane.PointToDist (spot, newheight);
			plat->m_Low = sec->floorplane.fD();

			if (plat->m_High > sec->floorplane.fD())
				plat->m_High = sec->floorplane.fD();

			plat->m_Status = DPlat::up;
			plat->PlayPlatSound ("Platform");
			break;

		case DPlat::platPerpetualRaise:
			newheight = sec->FindLowestFloorSurrounding (&spot) + lip;
			plat->m_Low =  sec->floorplane.PointToDist (spot, newheight);

			if (plat->m_Low < sec->floorplane.fD())
				plat->m_Low = sec->floorplane.fD();

			newheight = sec->FindHighestFloorSurrounding (&spot);
			plat->m_High =  sec->floorplane.PointToDist (spot, newheight);

			if (plat->m_High > sec->floorplane.fD())
				plat->m_High = sec->floorplane.fD();

			plat->m_Status = pr_doplat() & 1 ? DPlat::up : DPlat::down;

			plat->PlayPlatSound ("Platform");
			break;

		case DPlat::platToggle:	//jff 3/14/98 add new type to support instant toggle
			plat->m_Crush = 10;	//jff 3/14/98 crush anything in the way

			// set up toggling between ceiling, floor inclusive
			newheight = sec->FindLowestCeilingPoint (&spot);
			plat->m_Low = sec->floorplane.PointToDist (spot, newheight);
			plat->m_High = sec->floorplane.fD();
			plat->m_Status = DPlat::down;
			SN_StartSequence (sec, CHAN_FLOOR, "Silence", 0);
			break;

		case DPlat::platDownToNearestFloor:
			newheight = sec->FindNextLowestFloor (&spot) + lip;
			plat->m_Low = sec->floorplane.PointToDist (spot, newheight);
			plat->m_Status = DPlat::down;
			plat->m_High = sec->floorplane.fD();
			plat->PlayPlatSound ("Platform");
			break;

		case DPlat::platDownToLowestCeiling:
			newheight = sec->FindLowestCeilingSurrounding (&spot);
		    plat->m_Low = sec->floorplane.PointToDist (spot, newheight);
			plat->m_High = sec->floorplane.fD();

			if (plat->m_Low < sec->floorplane.fD())
				plat->m_Low = sec->floorplane.fD();

			plat->m_Status = DPlat::down;
			plat->PlayPlatSound ("Platform");
			break;

		default:
			break;
		}
	}
	return rtn;
}